

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

string_format_info * __thiscall
toml::basic_value<toml::type_config>::as_string_fmt(basic_value<toml::type_config> *this)

{
  allocator<char> local_31;
  string local_30;
  
  if (this->type_ == string) {
    return (string_format_info *)((long)&this->field_1 + 0x20);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"toml::value::as_string_fmt()",&local_31);
  throw_bad_cast(this,&local_30,string);
}

Assistant:

string_format_info const& as_string_fmt() const
    {
        if(this->type_ != value_t::string)
        {
            this->throw_bad_cast("toml::value::as_string_fmt()", value_t::string);
        }
        return this->string_.format;
    }